

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall
cmCPackIFWPackage::ConfigureFromGroup(cmCPackIFWPackage *this,cmCPackComponentGroup *group)

{
  cmCPackLog *pcVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  string *psVar6;
  string local_558 [32];
  undefined1 local_538 [8];
  ostringstream cmCPackLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  char *local_3a0;
  char *option_3;
  undefined1 local_378 [8];
  ostringstream cmCPackLog_msg;
  allocator local_1f9;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  char *local_1b8;
  char *option_2;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  char *local_168;
  char *option_1;
  char *local_140;
  char *option;
  string local_130;
  char *local_110;
  char *optPACKAGE_VERSION;
  char *local_e8;
  char *optVERSION;
  key_type local_d8;
  allocator local_b1;
  key_type local_b0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string prefix;
  cmCPackComponentGroup *group_local;
  cmCPackIFWPackage *this_local;
  
  if (group == (cmCPackComponentGroup *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    prefix.field_2._8_8_ = group;
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_80,(string *)prefix.field_2._8_8_);
    std::operator+(&local_60,"CPACK_IFW_COMPONENT_GROUP_",&local_80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"_");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    psVar6 = (string *)(prefix.field_2._8_8_ + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar2,psVar6);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    psVar6 = (string *)(prefix.field_2._8_8_ + 0x40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"",(allocator *)((long)&optVERSION + 7));
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,&local_d8);
    std::__cxx11::string::operator=((string *)pmVar2,psVar6);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optVERSION + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &optPACKAGE_VERSION,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "VERSION");
    pcVar3 = cmCPackIFWCommon::GetOption
                       (&this->super_cmCPackIFWCommon,(string *)&optPACKAGE_VERSION);
    std::__cxx11::string::~string((string *)&optPACKAGE_VERSION);
    local_e8 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_130,"CPACK_PACKAGE_VERSION",(allocator *)((long)&option + 7));
      pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option + 7));
      local_110 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&this->Version,"1.0.0");
      }
      else {
        std::__cxx11::string::operator=((string *)&this->Version,pcVar3);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Version,pcVar3);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "SCRIPT");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&option_1);
    std::__cxx11::string::~string((string *)&option_1);
    local_140 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Script,pcVar3);
    }
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "USER_INTERFACES");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    local_168 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->UserInterfaces);
      pcVar3 = local_168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a8,pcVar3,(allocator *)((long)&option_2 + 7));
      cmSystemTools::ExpandListArgument(&local_1a8,&this->UserInterfaces,false);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option_2 + 7));
    }
    std::operator+(&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "LICENSES");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    local_1b8 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Licenses);
      pcVar3 = local_1b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,pcVar3,&local_1f9);
      cmSystemTools::ExpandListArgument(&local_1f8,&this->Licenses,false);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Licenses);
      if ((sVar4 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
        poVar5 = std::operator<<((ostream *)local_378,(string *)local_40);
        poVar5 = std::operator<<(poVar5,"LICENSES");
        poVar5 = std::operator<<(poVar5," should contain pairs of <display_name> and <file_path>.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
          pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,299,pcVar3);
          std::__cxx11::string::~string((string *)&option_3);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->Licenses);
      }
    }
    std::operator+(&local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "PRIORITY");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    local_3a0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->SortingPriority,pcVar3);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_538);
      poVar5 = std::operator<<((ostream *)local_538,"The \"PRIORITY\" option is set ");
      poVar5 = std::operator<<(poVar5,"for component group \"");
      poVar5 = std::operator<<(poVar5,(string *)prefix.field_2._8_8_);
      poVar5 = std::operator<<(poVar5,"\", but there option is ");
      poVar5 = std::operator<<(poVar5,"deprecated. Please use \"SORTING_PRIORITY\" option instead.")
      ;
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0x138,pcVar3);
        std::__cxx11::string::~string(local_558);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_538);
    }
    this_local._4_4_ = ConfigureFromPrefix(this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromGroup(cmCPackComponentGroup* group)
{
  if (!group) {
    return 0;
  }

  // Restore defaul configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_GROUP_" +
    cmsys::SystemTools::UpperCase(group->Name) + "_";

  this->DisplayName[""] = group->DisplayName;
  this->Description[""] = group->Description;

  // Version
  if (const char* optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = optVERSION;
  } else if (const char* optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (const char* option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = option;
  }

  // User interfaces
  if (const char* option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmSystemTools::ExpandListArgument(option, this->UserInterfaces);
  }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmSystemTools::ExpandListArgument(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (const char* option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = option;
    cmCPackIFWLogger(
      WARNING, "The \"PRIORITY\" option is set "
        << "for component group \"" << group->Name
        << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  return this->ConfigureFromPrefix(prefix);
}